

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::VectorShuffleFeedingExtract::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *param_3)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  Instruction *this_00;
  TypeManager *pTVar1;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *pvVar2;
  Op OVar3;
  uint32_t uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint32_t local_10c;
  iterator local_108;
  undefined8 local_100;
  SmallVector<unsigned_int,_2UL> local_f8;
  uint32_t local_cc;
  iterator local_c8;
  undefined8 local_c0;
  SmallVector<unsigned_int,_2UL> local_b8;
  uint32_t local_8c;
  undefined1 local_88 [4];
  uint32_t new_vector;
  undefined4 local_6c;
  uint32_t local_68;
  uint32_t undef_literal_value;
  uint32_t new_index;
  uint32_t first_input_size;
  Type *first_input_type;
  Instruction *first_input;
  Instruction *cinst;
  TypeManager *pTStack_40;
  uint32_t cid;
  TypeManager *type_mgr;
  DefUseManager *def_use_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_3_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  def_use_mgr = (DefUseManager *)param_3;
  param_3_local =
       (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        *)inst;
  inst_local = (Instruction *)context;
  context_local = (IRContext *)this;
  OVar3 = opt::Instruction::opcode(inst);
  if (OVar3 != OpCompositeExtract) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeExtract && \"Wrong opcode.  Should be OpCompositeExtract.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x76f,
                  "auto spvtools::opt::(anonymous namespace)::VectorShuffleFeedingExtract()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  type_mgr = (TypeManager *)IRContext::get_def_use_mgr((IRContext *)inst_local);
  pTStack_40 = IRContext::get_type_mgr((IRContext *)inst_local);
  cinst._4_4_ = opt::Instruction::GetSingleWordInOperand((Instruction *)param_3_local,0);
  first_input = analysis::DefUseManager::GetDef((DefUseManager *)type_mgr,cinst._4_4_);
  OVar3 = opt::Instruction::opcode(first_input);
  pTVar1 = type_mgr;
  if (OVar3 == OpVectorShuffle) {
    uVar4 = opt::Instruction::GetSingleWordInOperand(first_input,0);
    first_input_type = (Type *)analysis::DefUseManager::GetDef((DefUseManager *)pTVar1,uVar4);
    pTVar1 = pTStack_40;
    uVar4 = opt::Instruction::type_id((Instruction *)first_input_type);
    _new_index = analysis::TypeManager::GetType(pTVar1,uVar4);
    iVar5 = (*_new_index->_vptr_Type[0xd])();
    if (CONCAT44(extraout_var,iVar5) == 0) {
      __assert_fail("first_input_type->AsVector() && \"Input to vector shuffle should be vectors.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x77f,
                    "auto spvtools::opt::(anonymous namespace)::VectorShuffleFeedingExtract()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                   );
    }
    iVar5 = (*_new_index->_vptr_Type[0xd])();
    undef_literal_value = analysis::Vector::element_count((Vector *)CONCAT44(extraout_var_00,iVar5))
    ;
    this_00 = first_input;
    uVar4 = opt::Instruction::GetSingleWordInOperand((Instruction *)param_3_local,1);
    local_68 = opt::Instruction::GetSingleWordInOperand(this_00,uVar4 + 2);
    local_6c = 0xffffffff;
    if (local_68 == 0xffffffff) {
      opt::Instruction::SetOpcode((Instruction *)param_3_local,OpUndef);
      pvVar2 = param_3_local;
      memset(local_88,0,0x18);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_88
                );
      opt::Instruction::SetInOperands((Instruction *)pvVar2,(OperandList *)local_88);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_88
                );
      this_local._7_1_ = true;
    }
    else {
      local_8c = 0;
      if (local_68 < undef_literal_value) {
        local_8c = opt::Instruction::GetSingleWordInOperand(first_input,0);
      }
      else {
        local_8c = opt::Instruction::GetSingleWordInOperand(first_input,1);
        local_68 = local_68 - undef_literal_value;
      }
      pvVar2 = param_3_local;
      local_cc = local_8c;
      local_c8 = &local_cc;
      local_c0 = 1;
      init_list_00._M_len = 1;
      init_list_00._M_array = local_c8;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b8,init_list_00);
      opt::Instruction::SetInOperand((Instruction *)pvVar2,0,&local_b8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
      pvVar2 = param_3_local;
      local_10c = local_68;
      local_108 = &local_10c;
      local_100 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_108;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f8,init_list);
      opt::Instruction::SetInOperand((Instruction *)pvVar2,1,&local_f8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f8);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

FoldingRule VectorShuffleFeedingExtract() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>&) {
    assert(inst->opcode() == spv::Op::OpCompositeExtract &&
           "Wrong opcode.  Should be OpCompositeExtract.");
    analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();
    analysis::TypeManager* type_mgr = context->get_type_mgr();
    uint32_t cid = inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
    Instruction* cinst = def_use_mgr->GetDef(cid);

    if (cinst->opcode() != spv::Op::OpVectorShuffle) {
      return false;
    }

    // Find the size of the first vector operand of the VectorShuffle
    Instruction* first_input =
        def_use_mgr->GetDef(cinst->GetSingleWordInOperand(0));
    analysis::Type* first_input_type =
        type_mgr->GetType(first_input->type_id());
    assert(first_input_type->AsVector() &&
           "Input to vector shuffle should be vectors.");
    uint32_t first_input_size = first_input_type->AsVector()->element_count();

    // Get index of the element the vector shuffle is placing in the position
    // being extracted.
    uint32_t new_index =
        cinst->GetSingleWordInOperand(2 + inst->GetSingleWordInOperand(1));

    // Extracting an undefined value so fold this extract into an undef.
    const uint32_t undef_literal_value = 0xffffffff;
    if (new_index == undef_literal_value) {
      inst->SetOpcode(spv::Op::OpUndef);
      inst->SetInOperands({});
      return true;
    }

    // Get the id of the of the vector the elemtent comes from, and update the
    // index if needed.
    uint32_t new_vector = 0;
    if (new_index < first_input_size) {
      new_vector = cinst->GetSingleWordInOperand(0);
    } else {
      new_vector = cinst->GetSingleWordInOperand(1);
      new_index -= first_input_size;
    }

    // Update the extract instruction.
    inst->SetInOperand(kExtractCompositeIdInIdx, {new_vector});
    inst->SetInOperand(1, {new_index});
    return true;
  };
}